

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall
crnlib::mipmapped_texture::flip_y(mipmapped_texture *this,bool update_orientation_flags)

{
  bool bVar1;
  uint uVar2;
  mip_ptr_vec *pmVar3;
  mip_level **ppmVar4;
  byte in_SIL;
  uint orient_flags;
  uint m;
  uint f;
  mipmapped_texture temp_tex;
  mipmapped_texture *in_stack_ffffffffffffff28;
  uint face;
  mipmapped_texture *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined8 in_stack_ffffffffffffff40;
  undefined1 uncook;
  mipmapped_texture *in_stack_ffffffffffffff48;
  mipmapped_texture *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar5;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  orientation_flags_t local_7c;
  uint local_78;
  uint local_74;
  bool local_1;
  
  uncook = (undefined1)((ulong)in_stack_ffffffffffffff40 >> 0x38);
  mipmapped_texture((mipmapped_texture *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
  bVar1 = flip_y_helper((mipmapped_texture *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (!bVar1) {
    operator=((mipmapped_texture *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              (mipmapped_texture *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    unpack_from_dxt(in_stack_ffffffffffffff48,(bool)uncook);
    bVar1 = flip_y_helper((mipmapped_texture *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    if (!bVar1) {
      local_1 = false;
      goto LAB_00174375;
    }
  }
  swap(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if ((in_SIL & 1) != 0) {
    local_74 = 0;
    while (uVar5 = local_74, uVar2 = get_num_faces((mipmapped_texture *)0x17425a), uVar5 < uVar2) {
      local_78 = 0;
      while( true ) {
        pmVar3 = get_face(in_stack_ffffffffffffff30,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20)
                         );
        uVar2 = vector<crnlib::mip_level_*>::size(pmVar3);
        face = (uint)((ulong)in_stack_ffffffffffffff28 >> 0x20);
        if (uVar2 <= local_78) break;
        pmVar3 = get_face(in_stack_ffffffffffffff30,face);
        ppmVar4 = vector<crnlib::mip_level_*>::operator[](pmVar3,local_78);
        local_7c = mip_level::get_orientation_flags(*ppmVar4);
        local_7c = local_7c ^ cOrientationFlagYFlipped;
        in_stack_ffffffffffffff30 = (mipmapped_texture *)get_face(in_stack_ffffffffffffff30,face);
        in_stack_ffffffffffffff28 =
             (mipmapped_texture *)
             vector<crnlib::mip_level_*>::operator[]
                       ((vector<crnlib::mip_level_*> *)in_stack_ffffffffffffff30,local_78);
        mip_level::set_orientation_flags(*(mip_level **)&in_stack_ffffffffffffff28->m_name,local_7c)
        ;
        local_78 = local_78 + 1;
      }
      local_74 = local_74 + 1;
    }
  }
  local_1 = true;
LAB_00174375:
  ~mipmapped_texture(in_stack_ffffffffffffff30);
  return local_1;
}

Assistant:

bool mipmapped_texture::flip_y(bool update_orientation_flags) {
  mipmapped_texture temp_tex(*this);
  if (!temp_tex.flip_y_helper()) {
    temp_tex = *this;
    temp_tex.unpack_from_dxt(true);
    if (!temp_tex.flip_y_helper())
      return false;
  }
  swap(temp_tex);

  if (update_orientation_flags) {
    for (uint f = 0; f < get_num_faces(); f++) {
      for (uint m = 0; m < get_face(f).size(); m++) {
        uint orient_flags = get_face(f)[m]->get_orientation_flags();
        orient_flags ^= cOrientationFlagYFlipped;
        get_face(f)[m]->set_orientation_flags(static_cast<orientation_flags_t>(orient_flags));
      }
    }
  }

  CRNLIB_ASSERT(check());

  return true;
}